

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralEvaporationSpectrum.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum::GeneralEvaporationSpectrum
          (GeneralEvaporationSpectrum *this,GeneralEvaporationSpectrum *param_1)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  uVar1 = *(undefined8 *)
           &(param_1->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>;
  lVar2 = ((_Head_base<4UL,_long,_false> *)
          ((long)&(param_1->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl;
  lVar3 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(param_1->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  lVar4 = ((_Head_base<2UL,_long,_false> *)
          ((long)&(param_1->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl;
  dVar5 = (param_1->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       ((_Head_base<1UL,_double,_false> *)
       ((long)&(param_1->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.
               fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl;
  (this->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = dVar5;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl = lVar3;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl = lVar4;
  *(undefined8 *)
   &(this->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long> = uVar1;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->temperature_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl = lVar2;
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->temperature_).super_TabulationRecord.super_InterpolationBase.boundaryIndices,
             &(param_1->temperature_).super_TabulationRecord.super_InterpolationBase.boundaryIndices
            );
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->temperature_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices,
             &(param_1->temperature_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->temperature_).super_TabulationRecord.xValues,
             &(param_1->temperature_).super_TabulationRecord.xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->temperature_).super_TabulationRecord.yValues,
             &(param_1->temperature_).super_TabulationRecord.yValues);
  uVar1 = *(undefined8 *)
           &(param_1->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>;
  lVar2 = ((_Head_base<4UL,_long,_false> *)
          ((long)&(param_1->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl;
  lVar3 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(param_1->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  lVar4 = ((_Head_base<2UL,_long,_false> *)
          ((long)&(param_1->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl;
  dVar5 = (param_1->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       ((_Head_base<1UL,_double,_false> *)
       ((long)&(param_1->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.
               fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl;
  (this->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = dVar5;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl = lVar3;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl = lVar4;
  *(undefined8 *)
   &(this->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long> = uVar1;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->distribution_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl = lVar2;
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->distribution_).super_TabulationRecord.super_InterpolationBase.boundaryIndices,
             &(param_1->distribution_).super_TabulationRecord.super_InterpolationBase.
              boundaryIndices);
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->distribution_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices,
             &(param_1->distribution_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->distribution_).super_TabulationRecord.xValues,
             &(param_1->distribution_).super_TabulationRecord.xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->distribution_).super_TabulationRecord.yValues,
             &(param_1->distribution_).super_TabulationRecord.yValues);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT GeneralEvaporationSpectrum {

  EffectiveTemperature temperature_;
  DistributionFunction distribution_;

public:

  /* constructor */
  #include "ENDFtk/section/5/GeneralEvaporationSpectrum/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the distribution type (the LF flag)
   */
  static constexpr int LF() { return 5; }

  /**
   *  @brief Return the distribution type (the LF flag)
   */
  int LAW() const { return this->LF(); }

  /**
   *  @brief Return the effective temperature
   */
  const EffectiveTemperature& theta() const { return this->temperature_; }

  /**
   *  @brief Return the effective temperature
   */
  const EffectiveTemperature& effectiveTemperature() const {

    return this->theta();
  }

  /**
   *  @brief Return the distribution function g(x)
   */
  const DistributionFunction& g() const { return this->distribution_; }

  /**
   *  @brief Return the distribution function g(x)
   */
  const DistributionFunction& distributionFunction() const { return this->g(); }

  #include "ENDFtk/section/5/GeneralEvaporationSpectrum/src/NC.hpp"
  #include "ENDFtk/section/5/GeneralEvaporationSpectrum/src/print.hpp"
}